

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

QByteArray * __thiscall
QMetaObjectBuilder::classInfoValue
          (QByteArray *__return_storage_ptr__,QMetaObjectBuilder *this,int index)

{
  Data *pDVar1;
  pointer pQVar2;
  ulong uVar3;
  
  if (-1 < index) {
    uVar3 = (ulong)(uint)index;
    if (uVar3 < (ulong)(this->d->classInfoValues).d.size) {
      pQVar2 = QList<QByteArray>::data(&this->d->classInfoValues);
      pDVar1 = pQVar2[uVar3].d.d;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = pQVar2[uVar3].d.ptr;
      (__return_storage_ptr__->d).size = pQVar2[uVar3].d.size;
      if (pDVar1 == (Data *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaObjectBuilder::classInfoValue(int index) const
{
    if (index >= 0 && index < d->classInfoValues.size())
        return d->classInfoValues[index];
    else
        return QByteArray();
}